

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  float local_1c;
  char **ppcStack_18;
  float r;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  ppcStack_18 = argv;
  argv_local._0_4_ = argc;
  printf("r = ");
  __isoc99_scanf("%f",&local_1c);
  printf(anon_var_dwarf_57,
         (double)((local_1c * local_1c * local_1c * 4.0) / 3.0) * 3.141592653589793);
  printf(anon_var_dwarf_6d,(double)(local_1c * local_1c * 4.0) * 3.141592653589793);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
  float r;
  printf("r = ");
  scanf("%f", &r);

  printf("V = %f m³\n", r * r * r * 4.0f / 3.0f * M_PI);
  printf("S = %f m²\n", r * r * 4.0f * M_PI);

  return 0;
}